

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O0

void Saig_ManBlockPo(Aig_Man_t *pAig,int nCycles)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  int local_3c;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pPrev;
  Aig_Obj_t *pCond;
  Aig_Obj_t *pObj;
  int nCycles_local;
  Aig_Man_t *pAig_local;
  
  if (nCycles < 1) {
    __assert_fail("nCycles > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDual.c"
                  ,0xd5,"void Saig_ManBlockPo(Aig_Man_t *, int)");
  }
  pTemp = Aig_ManConst1(pAig);
  pPrev = Aig_ManConst1(pAig);
  for (local_3c = 0; local_3c < nCycles; local_3c = local_3c + 1) {
    Aig_ObjCreateCo(pAig,pTemp);
    pTemp = Aig_ObjCreateCi(pAig);
    pPrev = Aig_And(pAig,pPrev,pTemp);
  }
  for (local_3c = 0; iVar1 = Saig_ManPoNum(pAig), local_3c < iVar1; local_3c = local_3c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_3c);
    pAVar2 = Aig_ObjChild0(pObj_00);
    pAVar2 = Aig_And(pAig,pAVar2,pPrev);
    Aig_ObjPatchFanin0(pAig,pObj_00,pAVar2);
  }
  iVar1 = Aig_ManRegNum(pAig);
  Aig_ManSetRegNum(pAig,iVar1 + nCycles);
  Aig_ManCleanup(pAig);
  return;
}

Assistant:

void Saig_ManBlockPo( Aig_Man_t * pAig, int nCycles )
{
    Aig_Obj_t * pObj, * pCond, * pPrev, * pTemp;
    int i;
    assert( nCycles > 0 );
    // add N flops (assuming 1-hot encoding of cycles)
    pPrev = Aig_ManConst1(pAig);
    pCond = Aig_ManConst1(pAig);
    for ( i = 0; i < nCycles; i++ )
    {
        Aig_ObjCreateCo( pAig, pPrev );
        pPrev = Aig_ObjCreateCi( pAig );
        pCond = Aig_And( pAig, pCond, pPrev );
    }
    // update the POs
    Saig_ManForEachPo( pAig, pObj, i )
    {
        pTemp = Aig_And( pAig, Aig_ObjChild0(pObj), pCond );
        Aig_ObjPatchFanin0( pAig, pObj, pTemp );
    }
    // set the flops
    Aig_ManSetRegNum( pAig, Aig_ManRegNum(pAig) + nCycles );
    Aig_ManCleanup( pAig );
}